

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState
          (WindowConstantAggregatorGlobalState *this,ClientContext *context,
          WindowConstantAggregator *aggregator,idx_t group_count,ValidityMask *partition_mask)

{
  vector<unsigned_long,_true> *this_00;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_01;
  unsigned_long *puVar1;
  iterator iVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  ulong uVar5;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> this_02;
  ulong uVar6;
  ulong uVar7;
  idx_t start;
  LogicalType local_58;
  WindowConstantAggregator *local_40;
  idx_t local_38;
  
  local_38 = group_count;
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             0x800);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowConstantAggregatorGlobalState_0246bb38;
  this_00 = &this->partition_offsets;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  WindowAggregateStates::WindowAggregateStates
            (&this->statef,&(this->super_WindowAggregatorGlobalState).aggr);
  this_01 = &this->results;
  (this->results).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  local_40 = aggregator;
  if ((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
      (unsigned_long *)0x0) {
    local_58._0_8_ = (ulong)(uint)local_58._4_4_ << 0x20;
    __position._M_current =
         (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<int>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,__position,
                 (int *)&local_58);
    }
    else {
      *__position._M_current = 0;
      (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    local_58.id_ = INVALID;
    local_58.physical_type_ = ~INVALID;
    local_58._2_6_ = 0;
    if (group_count != 0) {
      uVar5 = 0;
      do {
        puVar1 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar1[uVar5 >> 6];
        }
        uVar7 = (ulong)((uint)uVar5 & 0x3f);
        if (uVar6 == 0 && uVar7 == 0) {
          uVar5 = uVar5 + 0x40;
          local_58._0_8_ = uVar5;
        }
        else {
          while (uVar5 < group_count) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              iVar2._M_current =
                   (this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (this->partition_offsets).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,
                           (unsigned_long *)&local_58);
              }
              else {
                *iVar2._M_current = uVar5;
                (this->partition_offsets).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
            }
            uVar5 = local_58._0_8_ + 1;
            local_58._0_8_ = uVar5;
            if (0x3e < uVar7) break;
            uVar7 = uVar7 + 1;
          }
        }
      } while (uVar5 < group_count);
    }
  }
  puVar3 = (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::Vector_*,_false>)operator_new(0x68);
  LogicalType::LogicalType(&local_58,&(local_40->super_WindowAggregator).result_type);
  Vector::Vector((Vector *)this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,
                 &local_58,(long)puVar3 - (long)puVar4 >> 3);
  LogicalType::~LogicalType(&local_58);
  __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
       (this_01->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
       super__Head_base<0UL,_duckdb::Vector_*,_false>;
  (this_01->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false> =
       this_02.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
  if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)this_01,
               (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
  }
  WindowAggregateStates::Initialize
            (&this->statef,
             (long)(this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  iVar2._M_current =
       (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = group_count;
    (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState(ClientContext &context,
                                                                         const WindowConstantAggregator &aggregator,
                                                                         idx_t group_count,
                                                                         const ValidityMask &partition_mask)
    : WindowAggregatorGlobalState(context, aggregator, STANDARD_VECTOR_SIZE), statef(aggr) {

	// Locate the partition boundaries
	if (partition_mask.AllValid()) {
		partition_offsets.emplace_back(0);
	} else {
		idx_t entry_idx;
		idx_t shift;
		for (idx_t start = 0; start < group_count;) {
			partition_mask.GetEntryIndex(start, entry_idx, shift);

			//	If start is aligned with the start of a block,
			//	and the block is blank, then skip forward one block.
			const auto block = partition_mask.GetValidityEntry(entry_idx);
			if (partition_mask.NoneValid(block) && !shift) {
				start += ValidityMask::BITS_PER_VALUE;
				continue;
			}

			// Loop over the block
			for (; shift < ValidityMask::BITS_PER_VALUE && start < group_count; ++shift, ++start) {
				if (partition_mask.RowIsValid(block, shift)) {
					partition_offsets.emplace_back(start);
				}
			}
		}
	}

	//	Initialise the vector for caching the results
	results = make_uniq<Vector>(aggregator.result_type, partition_offsets.size());

	//	Initialise the final states
	statef.Initialize(partition_offsets.size());

	// Add final guard
	partition_offsets.emplace_back(group_count);
}